

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigcache.cpp
# Opt level: O0

void __thiscall SignatureCache::SignatureCache(SignatureCache *this,size_t max_size_bytes)

{
  long lVar1;
  string_view source_file;
  string_view logging_function;
  type_conflict1 *ptVar2;
  ConstevalFormatString<3U> in_RSI;
  size_t in_RDI;
  LogFlags flag;
  long in_FS_OFFSET;
  Level in_stack_00000080;
  type *approx_size_bytes;
  type *num_elems;
  uint *in_stack_000000a0;
  uint256 nonce;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  char *in_stack_fffffffffffffef0;
  cache<uint256,_SignatureCacheHasher> *in_stack_fffffffffffffef8;
  uchar *in_stack_ffffffffffffff00;
  CSHA256 *in_stack_ffffffffffffff08;
  int source_line;
  size_t sVar3;
  char *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = in_RDI;
  CSHA256::CSHA256((CSHA256 *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  CSHA256::CSHA256((CSHA256 *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  flag = in_RDI + (RPC|WALLETDB|BENCH);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::cache(in_stack_fffffffffffffef8);
  source_line = (int)(in_RDI >> 0x20);
  std::shared_mutex::shared_mutex
            ((shared_mutex *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  GetRandHash();
  base_blob<256U>::begin
            ((base_blob<256U> *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  CSHA256::Write(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                 (size_t)in_stack_fffffffffffffef8);
  CSHA256::Write(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                 (size_t)in_stack_fffffffffffffef8);
  base_blob<256U>::begin
            ((base_blob<256U> *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  CSHA256::Write(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                 (size_t)in_stack_fffffffffffffef8);
  CSHA256::Write(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                 (size_t)in_stack_fffffffffffffef8);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::setup_bytes
            (in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0);
  std::get<0ul,unsigned_int,unsigned_long>
            ((pair<unsigned_int,_unsigned_long> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  ptVar2 = std::get<1ul,unsigned_int,unsigned_long>
                     ((pair<unsigned_int,_unsigned_long> *)
                      CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffef8,
             in_stack_fffffffffffffef0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffef8,
             in_stack_fffffffffffffef0);
  logging_function._M_str = in_stack_ffffffffffffffa8;
  logging_function._M_len = *ptVar2 >> 0x14;
  source_file._M_str = in_RSI.fmt >> 0x14;
  source_file._M_len = sVar3;
  LogPrintFormatInternal<unsigned_long,unsigned_long,unsigned_int>
            (logging_function,source_file,source_line,flag,in_stack_00000080,in_RSI,
             approx_size_bytes,(unsigned_long *)num_elems,in_stack_000000a0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SignatureCache::SignatureCache(const size_t max_size_bytes)
{
    uint256 nonce = GetRandHash();
    // We want the nonce to be 64 bytes long to force the hasher to process
    // this chunk, which makes later hash computations more efficient. We
    // just write our 32-byte entropy, and then pad with 'E' for ECDSA and
    // 'S' for Schnorr (followed by 0 bytes).
    static constexpr unsigned char PADDING_ECDSA[32] = {'E'};
    static constexpr unsigned char PADDING_SCHNORR[32] = {'S'};
    m_salted_hasher_ecdsa.Write(nonce.begin(), 32);
    m_salted_hasher_ecdsa.Write(PADDING_ECDSA, 32);
    m_salted_hasher_schnorr.Write(nonce.begin(), 32);
    m_salted_hasher_schnorr.Write(PADDING_SCHNORR, 32);

    const auto [num_elems, approx_size_bytes] = setValid.setup_bytes(max_size_bytes);
    LogPrintf("Using %zu MiB out of %zu MiB requested for signature cache, able to store %zu elements\n",
              approx_size_bytes >> 20, max_size_bytes >> 20, num_elems);
}